

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

void reorder_invent(void)

{
  obj *poVar1;
  bool bVar2;
  obj *poVar3;
  obj *poVar4;
  obj **ppoVar5;
  
  do {
    bVar2 = false;
    poVar3 = invent;
    poVar4 = (obj *)0x0;
    while (ppoVar5 = &poVar4->nobj, poVar4 = poVar3, poVar4 != (obj *)0x0) {
      poVar1 = poVar4->nobj;
      if (poVar1 == (obj *)0x0) {
        poVar3 = (obj *)0x0;
      }
      else {
        poVar3 = poVar1;
        if ((char)(poVar1->invlet ^ 0x20U) < (char)(poVar4->invlet ^ 0x20U)) {
          if ((obj *)ppoVar5 == (obj *)0x0) {
            ppoVar5 = &invent;
          }
          ((obj *)ppoVar5)->nobj = poVar1;
          poVar4->nobj = poVar1->nobj;
          poVar1->nobj = poVar4;
          bVar2 = true;
          poVar3 = poVar4;
          poVar4 = poVar1;
        }
      }
    }
  } while (bVar2);
  return;
}

Assistant:

static void reorder_invent(void)
{
	struct obj *otmp, *prev, *next;
	boolean need_more_sorting;

	do {
	    /*
	     * We expect at most one item to be out of order, so this
	     * isn't nearly as inefficient as it may first appear.
	     */
	    need_more_sorting = FALSE;
	    for (otmp = invent, prev = 0; otmp; ) {
		next = otmp->nobj;
		if (next && inv_rank(next) < inv_rank(otmp)) {
		    need_more_sorting = TRUE;
		    if (prev) prev->nobj = next;
		    else      invent = next;
		    otmp->nobj = next->nobj;
		    next->nobj = otmp;
		    prev = next;
		} else {
		    prev = otmp;
		    otmp = next;
		}
	    }
	} while (need_more_sorting);
}